

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_module.cpp
# Opt level: O1

void __thiscall dxil_spv::SPIRVModule::Impl::build_discard_call_exit(Impl *this)

{
  Builder *this_00;
  Block *pBVar1;
  Id IVar2;
  Function *pFVar3;
  Block *thenBlock;
  Block *mergeBlock;
  Block *entry;
  _Head_base<0UL,_spv::Instruction_*,_false> local_78;
  Block *local_70;
  Vector<Id> local_68;
  vector<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
  local_48;
  
  this_00 = &this->builder;
  pBVar1 = (this->builder).buildPoint;
  if (this->discard_function == (Function *)0x0) {
    local_70 = (Block *)0x0;
    IVar2 = spv::Builder::makeVoidType(this_00);
    local_68.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_68.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_start = (pointer)0x0;
    local_68.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_finish = (pointer)0x0;
    local_48.
    super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_48.
    super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_48.
    super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    pFVar3 = spv::Builder::makeFunctionEntry
                       (this_00,DecorationMax,IVar2,"discard_exit",&local_68,&local_48,&local_70);
    this->discard_function = pFVar3;
    std::
    vector<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
    ::~vector(&local_48);
    if (local_68.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      free_in_thread(local_68.
                     super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                     ._M_impl.super__Vector_impl_data._M_start);
    }
    thenBlock = (Block *)allocate_in_thread(0x78);
    IVar2 = (this->builder).uniqueId + 1;
    (this->builder).uniqueId = IVar2;
    pFVar3 = this->discard_function;
    thenBlock->_vptr_Block = (_func_int **)&PTR__Block_001f8cc8;
    (thenBlock->instructions).
    super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (thenBlock->instructions).
    super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (thenBlock->instructions).
    super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (thenBlock->predecessors).
    super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (thenBlock->predecessors).
    super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (thenBlock->predecessors).
    super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (thenBlock->successors).
    super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (thenBlock->successors).
    super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (thenBlock->successors).
    super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (thenBlock->localVariables).
    super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (thenBlock->localVariables).
    super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (thenBlock->localVariables).
    super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    thenBlock->parent = pFVar3;
    thenBlock->unreachable = false;
    local_68.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_start = (pointer)allocate_in_thread(0x38);
    *(undefined ***)
     local_68.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
     _M_impl.super__Vector_impl_data._M_start = &PTR__Instruction_001f81e0;
    local_68.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_start[2] = IVar2;
    local_68.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_start[3] = 0;
    local_68.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_start[4] = 0xf8;
    local_68.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_start[6] = 0;
    local_68.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_start[7] = 0;
    local_68.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_start[8] = 0;
    local_68.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_start[9] = 0;
    local_68.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_start[10] = 0;
    local_68.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_start[0xb] = 0;
    local_68.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_start[0xc] = 0;
    local_68.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_start[0xd] = 0;
    std::
    vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
    ::emplace_back<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>
              ((vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
                *)&thenBlock->instructions,
               (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)&local_68);
    if (local_68.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*(long *)local_68.
                            super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_start + 8))();
    }
    ((thenBlock->instructions).
     super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
     ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
     super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>._M_t.
     super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
     super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl)->block = thenBlock;
    spv::Module::mapInstruction
              (pFVar3->parent,
               (thenBlock->instructions).
               super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
               super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>._M_t.
               super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
               super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl);
    mergeBlock = (Block *)allocate_in_thread(0x78);
    IVar2 = (this->builder).uniqueId + 1;
    (this->builder).uniqueId = IVar2;
    pFVar3 = this->discard_function;
    mergeBlock->_vptr_Block = (_func_int **)&PTR__Block_001f8cc8;
    (mergeBlock->instructions).
    super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (mergeBlock->instructions).
    super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (mergeBlock->instructions).
    super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (mergeBlock->predecessors).
    super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (mergeBlock->predecessors).
    super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (mergeBlock->predecessors).
    super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (mergeBlock->successors).
    super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (mergeBlock->successors).
    super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (mergeBlock->successors).
    super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (mergeBlock->localVariables).
    super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (mergeBlock->localVariables).
    super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (mergeBlock->localVariables).
    super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    mergeBlock->parent = pFVar3;
    mergeBlock->unreachable = false;
    local_68.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_start = (pointer)allocate_in_thread(0x38);
    *(undefined ***)
     local_68.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
     _M_impl.super__Vector_impl_data._M_start = &PTR__Instruction_001f81e0;
    local_68.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_start[2] = IVar2;
    local_68.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_start[3] = 0;
    local_68.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_start[4] = 0xf8;
    local_68.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_start[6] = 0;
    local_68.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_start[7] = 0;
    local_68.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_start[8] = 0;
    local_68.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_start[9] = 0;
    local_68.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_start[10] = 0;
    local_68.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_start[0xb] = 0;
    local_68.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_start[0xc] = 0;
    local_68.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_start[0xd] = 0;
    std::
    vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
    ::emplace_back<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>
              ((vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
                *)&mergeBlock->instructions,
               (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)&local_68);
    if (local_68.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*(long *)local_68.
                            super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_start + 8))();
    }
    ((mergeBlock->instructions).
     super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
     ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
     super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>._M_t.
     super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
     super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl)->block = mergeBlock;
    spv::Module::mapInstruction
              (pFVar3->parent,
               (mergeBlock->instructions).
               super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
               super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>._M_t.
               super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
               super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl);
    (this->builder).buildPoint = local_70;
    IVar2 = spv::Builder::createLoad(this_00,this->discard_state_var_id);
    spv::Builder::createSelectionMerge(this_00,mergeBlock,0);
    spv::Builder::createConditionalBranch(this_00,IVar2,thenBlock,mergeBlock);
    local_78._M_head_impl = (Instruction *)allocate_in_thread(0x38);
    (local_78._M_head_impl)->_vptr_Instruction = (_func_int **)&PTR__Instruction_001f81e0;
    (local_78._M_head_impl)->resultId = 0;
    (local_78._M_head_impl)->typeId = 0;
    (local_78._M_head_impl)->opCode = OpKill;
    ((local_78._M_head_impl)->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    ((local_78._M_head_impl)->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    ((local_78._M_head_impl)->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (local_78._M_head_impl)->block = (Block *)0x0;
    add_instruction(this,thenBlock,
                    (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)
                    &local_78);
    if (local_78._M_head_impl != (Instruction *)0x0) {
      (*(local_78._M_head_impl)->_vptr_Instruction[1])();
    }
    local_78._M_head_impl = (Instruction *)0x0;
    (this->builder).buildPoint = mergeBlock;
    spv::Builder::makeReturn(this_00,false,0);
  }
  (this->builder).buildPoint = pBVar1;
  local_68.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  spv::Builder::createFunctionCall(this_00,this->discard_function,&local_68);
  if (local_68.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    free_in_thread(local_68.
                   super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void SPIRVModule::Impl::build_discard_call_exit()
{
	auto *current_build_point = builder.getBuildPoint();

	if (!discard_function)
	{
		spv::Block *entry = nullptr;
		discard_function =
		    builder.makeFunctionEntry(spv::NoPrecision, builder.makeVoidType(), "discard_exit", {}, {}, &entry);

		auto *true_block = new spv::Block(builder.getUniqueId(), *discard_function);
		auto *false_block = new spv::Block(builder.getUniqueId(), *discard_function);

		builder.setBuildPoint(entry);
		spv::Id loaded_state = builder.createLoad(discard_state_var_id);
		builder.createSelectionMerge(false_block, 0);
		builder.createConditionalBranch(loaded_state, true_block, false_block);
		add_instruction(true_block, std::make_unique<spv::Instruction>(spv::OpKill));
		builder.setBuildPoint(false_block);
		builder.makeReturn(false);
	}

	builder.setBuildPoint(current_build_point);
	builder.createFunctionCall(discard_function, {});
}